

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPrePartialsStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,int *states2,double *matrices2,int startPattern,int endPattern)

{
  int *piVar1;
  double *pdVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  long lVar18;
  int k;
  long lVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  
  iVar6 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
  uVar7 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  iVar17 = startPattern * 4;
  for (uVar20 = 0; uVar20 != (~((int)uVar7 >> 0x1f) & uVar7); uVar20 = uVar20 + 1) {
    lVar21 = (long)iVar17;
    auVar3 = *(undefined1 (*) [32])(matrices1 + uVar20 * 0x14);
    pdVar2 = matrices1 + uVar20 * 0x14 + 5;
    dVar13 = *pdVar2;
    dVar14 = pdVar2[1];
    dVar15 = pdVar2[2];
    dVar16 = pdVar2[3];
    auVar4 = *(undefined1 (*) [32])(matrices1 + uVar20 * 0x14 + 10);
    auVar5 = *(undefined1 (*) [32])(matrices1 + uVar20 * 0x14 + 0xf);
    lVar19 = (long)startPattern;
    while (lVar19 < endPattern) {
      piVar1 = states2 + lVar19;
      lVar19 = lVar19 + 1;
      lVar18 = (long)*piVar1 + (long)((int)uVar20 * 0x14);
      dVar8 = partials1[lVar21 + 1] * matrices2[lVar18 + 5];
      dVar9 = partials1[lVar21] * matrices2[lVar18];
      dVar10 = partials1[lVar21 + 2] * matrices2[lVar18 + 10];
      dVar11 = partials1[lVar21 + 3] * matrices2[lVar18 + 0xf];
      auVar22._8_8_ = dVar9;
      auVar22._0_8_ = dVar9;
      auVar22._16_8_ = dVar9;
      auVar22._24_8_ = dVar9;
      auVar24._0_8_ = dVar13 * dVar8;
      auVar24._8_8_ = dVar14 * dVar8;
      auVar24._16_8_ = dVar15 * dVar8;
      auVar24._24_8_ = dVar16 * dVar8;
      auVar12 = vfmadd213pd_fma(auVar22,auVar3,auVar24);
      auVar25._8_8_ = dVar10;
      auVar25._0_8_ = dVar10;
      auVar25._16_8_ = dVar10;
      auVar25._24_8_ = dVar10;
      auVar12 = vfmadd213pd_fma(auVar25,auVar4,ZEXT1632(auVar12));
      auVar23._8_8_ = dVar11;
      auVar23._0_8_ = dVar11;
      auVar23._16_8_ = dVar11;
      auVar23._24_8_ = dVar11;
      auVar12 = vfmadd213pd_fma(auVar23,auVar5,ZEXT1632(auVar12));
      *(undefined1 (*) [32])(destP + lVar21) = ZEXT1632(auVar12);
      lVar21 = lVar21 + 4;
    }
    iVar17 = iVar17 + iVar6 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const int* states2,
                                                                    const REALTYPE* matrices2,
                                                                    int startPattern,
                                                                    int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
            u += 4*startPattern;
        }
        int w = l*4*OFFSET;


        PREFETCH_MATRIX_TRANSPOSE(1, matrices1, w); //m100, m101, ..., m133
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1, partials1, u); // p10, p11, p12, p13

            const int state2 = states2[k];
            PREFETCH_MATRIX_COLUMN(2, matrices2, w + state2); // sum20, sum21, sum22, sum23

            DO_SCHUR_PRODUCT(1, 1, 2); // reWrites p10, p11, p12, p13

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13

            // Final results
            destP[u] = sum10;
            destP[u + 1] = sum11;
            destP[u + 2] = sum12;
            destP[u + 3] = sum13;

            u += 4;

        }
    }
}